

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O1

void front::irGenerator::irGenerator::outputInstructions
               (ostream *out,MirPackage *package,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>_>_>
               *funcInsts)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  char cVar3;
  undefined8 uVar4;
  ostream *poVar5;
  _Rb_tree_node_base *p_Var6;
  long *plVar7;
  mapped_type *pmVar8;
  variant_alternative_t<0UL,_variant<shared_ptr<Inst>,_shared_ptr<JumpInstruction>,_shared_ptr<JumpLabelId>_>_>
  *pvVar9;
  variant_alternative_t<1UL,_variant<shared_ptr<Inst>,_shared_ptr<JumpInstruction>,_shared_ptr<JumpLabelId>_>_>
  *pvVar10;
  variant_alternative_t<2UL,_variant<shared_ptr<Inst>,_shared_ptr<JumpInstruction>,_shared_ptr<JumpLabelId>_>_>
  *pvVar11;
  _Base_ptr p_Var12;
  long *plVar13;
  undefined1 __rhs [8];
  pair<const_unsigned_int,_mir::inst::Variable> j;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>
  i;
  undefined1 local_e8 [8];
  Variable local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  MirPackage *local_a0;
  _Base_ptr local_98;
  undefined1 local_90 [32];
  undefined1 local_70 [8];
  variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  _Base_ptr local_38;
  
  local_90._0_8_ = local_90 + 0x10;
  local_a0 = package;
  local_98 = (_Base_ptr)funcInsts;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,">====== global_var ======<","");
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_90._0_8_,local_90._8_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  p_Var6 = (local_a0->global_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(local_a0->global_values)._M_t._M_impl.super__Rb_tree_header;
  cVar3 = (char)out;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>
      ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>
              *)local_90,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>
              *)(p_Var6 + 1));
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,(char *)local_90._0_8_,local_90._8_8_);
      local_e8 = (undefined1  [8])&local_e0.ty;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e8," : ","");
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,(char *)local_e8,(long)local_e0.super_Displayable._vptr_Displayable);
      if (local_e8 != (undefined1  [8])&local_e0.ty) {
        operator_delete((void *)local_e8,
                        (ulong)((long)&(local_e0.ty.
                                        super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_Displayable + 1));
      }
      arm::ConstValue::display((ConstValue *)local_70,out);
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr
        [local_68.
         super__Variant_base<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Move_assign_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
         .
         super__Copy_assign_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
         .
         super__Move_ctor_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
         .
         super__Copy_ctor_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
         .
         super__Variant_storage_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
         ._M_index]._M_data)((anon_class_1_0_00000001 *)local_e8,&local_68);
      local_68.
      super__Variant_base<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .
      super__Move_assign_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
      .
      super__Copy_assign_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
      .
      super__Move_ctor_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
      .
      super__Copy_ctor_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
      .
      super__Variant_storage_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
      ._M_index = 0xff;
      if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
        operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
      }
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  p_Var12 = (((_Rep_type *)&local_98->_M_color)->_M_impl).super__Rb_tree_header._M_header._M_left;
  local_98 = &(((_Rep_type *)&local_98->_M_color)->_M_impl).super__Rb_tree_header._M_header;
  if (p_Var12 != local_98) {
    local_a0 = (MirPackage *)&local_a0->functions;
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
      ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
              *)local_90,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
              *)(p_Var12 + 1));
      std::operator+(&local_c0,">====== function name : ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_c0);
      plVar13 = plVar7 + 2;
      if ((SharedTyPtr *)*plVar7 == (SharedTyPtr *)plVar13) {
        local_e0.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)*plVar13;
        local_e0.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[3];
        local_e8 = (undefined1  [8])&local_e0.ty;
      }
      else {
        local_e0.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)*plVar13;
        local_e8 = (undefined1  [8])*plVar7;
      }
      local_e0.super_Displayable._vptr_Displayable = (_func_int **)plVar7[1];
      *plVar7 = (long)plVar13;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      local_38 = p_Var12;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,(char *)local_e8,(long)local_e0.super_Displayable._vptr_Displayable);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if (local_e8 != (undefined1  [8])&local_e0.ty) {
        operator_delete((void *)local_e8,
                        (ulong)((long)&(local_e0.ty.
                                        super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_Displayable + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,">====== vars : ======<",0x16);
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
               ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                     *)local_a0,(key_type *)local_90);
      for (p_Var6 = (pmVar8->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != &(pmVar8->variables)._M_t._M_impl.super__Rb_tree_header;
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
        local_e8._4_4_ = (undefined4)((ulong)local_e8 >> 0x20);
        local_e8._0_4_ = p_Var6[1]._M_color;
        local_e0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eff98;
        local_e0.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)p_Var6[1]._M_left;
        local_e0.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var6[1]._M_right;
        if ((_Base_ptr)
            local_e0.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&((_Base_ptr)
                     local_e0.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_parent =
                 *(int *)&((_Base_ptr)
                          local_e0.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_M_parent + 1;
            UNLOCK();
          }
          else {
            *(int *)&((_Base_ptr)
                     local_e0.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_parent =
                 *(int *)&((_Base_ptr)
                          local_e0.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_M_parent + 1;
          }
        }
        local_e0._24_8_ = *(undefined8 *)(p_Var6 + 2);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)out);
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0," : ","");
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,local_c0._M_dataplus._M_p,local_c0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        mir::inst::Variable::display(&local_e0,out);
        std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
        local_e0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eff98;
        if ((_Base_ptr)
            local_e0.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e0.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,">====== instructions : ======<",0x1e);
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      uVar4 = local_68.
              super__Variant_base<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .
              super__Move_assign_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
              .
              super__Copy_assign_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
              .
              super__Move_ctor_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
              .
              super__Copy_ctor_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
              .
              super__Variant_storage_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
              ._M_u._0_8_;
      for (__rhs = local_70; __rhs != (undefined1  [8])uVar4;
          __rhs = (undefined1  [8])((long)__rhs + 0x18)) {
        std::__detail::__variant::
        _Copy_ctor_base<false,_std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                           *)local_e8,
                          (_Copy_ctor_base<false,_std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                           *)__rhs);
        std::__ostream_insert<char,std::char_traits<char>>(out,"  ",2);
        if ((__index_type)
            local_e0.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            '\x01') {
          pvVar10 = std::
                    get<1ul,std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                              ((variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                                *)local_e8);
          mir::inst::JumpInstruction::display
                    ((pvVar10->
                     super___shared_ptr<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,out);
        }
        else if ((__index_type)
                 local_e0.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 == '\0') {
          pvVar9 = std::
                   get<0ul,std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                             ((variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                               *)local_e8);
          peVar2 = (pvVar9->super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          (**(peVar2->super_Displayable)._vptr_Displayable)(peVar2,out);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(out,"label ",6);
          pvVar11 = std::
                    get<2ul,std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                              ((variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                                *)local_e8);
          std::ostream::operator<<
                    (out,((pvVar11->
                          super___shared_ptr<front::irGenerator::JumpLabelId,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->_jumpLabelId);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_&>
          ::_S_vtable._M_arr
          [(ulong)local_e0.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           & 0xff]._M_data)((anon_class_1_0_00000001 *)&local_c0,
                            (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                             *)local_e8);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      std::
      vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
      ::~vector((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                 *)local_70);
      if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
        operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
      }
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(local_38);
    } while (p_Var12 != local_98);
  }
  return;
}

Assistant:

void irGenerator::outputInstructions(
    std::ostream &out, mir::inst::MirPackage &package,
    std::map<std::string, std::vector<Instruction>> funcInsts) {
  out << (string) ">====== global_var ======<" << std::endl;
  for (auto i : package.global_values) {
    out << i.first << (string) " : ";
    i.second.display(out);
    out << std::endl;
  }

  for (auto i : funcInsts) {
    out << ">====== function name : " + i.first + "======<" << std::endl;
    out << ">====== vars : ======<" << std::endl;
    for (auto j : package.functions.at(i.first).variables) {
      out << j.first << (string) " : ";
      j.second.display(out);
      out << std::endl;
    }

    out << ">====== instructions : ======<" << std::endl;

    for (auto j : i.second) {
      out << "  ";
      if (j.index() == 0) {
        get<0>(j)->display(out);
      } else if (j.index() == 1) {
        get<1>(j)->display(out);
      } else {
        out << "label " << get<2>(j)->_jumpLabelId;
      }
      out << std::endl;
    }
    out << std::endl;
  }
}